

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Node::GetOutBk(Node *this)

{
  Block *this_00;
  bool bVar1;
  network_address_t nVar2;
  Network *pNVar3;
  char *pcVar4;
  ostream *poVar5;
  BlockAddressed bka;
  Block BStack_288;
  BlockAddressed local_1f0;
  Block local_150;
  BlockAddressed local_b8;
  
  this_00 = &local_b8.bk;
  Block::Block(this_00);
  pNVar3 = Network::instance();
  bVar1 = Network::List_Blocks(pNVar3);
  if (bVar1) {
    pcVar4 = anon_var_dwarf_2e252;
    poVar5 = (ostream *)&std::cout;
  }
  else {
    pNVar3 = Network::instance();
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    Network::RecvBlock(&local_1f0,pNVar3,nVar2);
    BlockAddressed::operator=(&local_b8,&local_1f0);
    Block::~Block(&local_1f0.bk);
    Block::Block(&BStack_288,this_00);
    Blockchain::AddBlock(&local_150,&this->bChain,&BStack_288);
    Block::~Block(&local_150);
    Block::~Block(&BStack_288);
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    if (nVar2 != 3) goto LAB_00105556;
    poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2e1cf);
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,nVar2);
    poVar5 = std::operator<<(poVar5,anon_var_dwarf_2e224);
    Block::GetBIndex(this_00);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pcVar4 = anon_var_dwarf_2e23b;
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00105556:
  Block::~Block(this_00);
  return;
}

Assistant:

void Node::GetOutBk() {
  BlockAddressed bka;
  if (!Network::instance().List_Blocks())
  {
     bka = Network::instance().RecvBlock(GetNodeAdd());
     bChain.AddBlock(bka.bk);
     if (GetNodeAdd() == 3)
      std::cout << "节点：" << GetNodeAdd() <<" 添加第 "<< bka.bk.GetBIndex() <<" 个区块. "<< std::endl;
    //std::cout << "Merkle_root:" << bka.bk.GetMerkleRoot()<<std::endl;
  }
  else
    std::cout << "区块列表为空！"<<std::endl;
}